

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O3

void __thiscall FIX43::Message::Message(Message *this,MsgType *msgtype)

{
  long *local_98;
  long local_90;
  long local_88 [2];
  undefined1 local_78 [16];
  _Alloc_hider local_68;
  char local_58 [16];
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  field_metrics local_28;
  
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"FIX.4.3","");
  local_78._0_8_ = &PTR__FieldBase_00151e98;
  local_78._8_4_ = 8;
  local_68._M_p = local_58;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_98,local_90 + (long)local_98);
  local_48._M_p = (pointer)&local_38;
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_28.m_length = 0;
  local_28.m_checksum = 0;
  local_78._0_8_ = &PTR__FieldBase_00152120;
  FIX::Message::Message(&this->super_Message,(BeginString *)local_78,msgtype);
  FIX::FieldBase::~FieldBase((FieldBase *)local_78);
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  *(undefined ***)this = &PTR__Message_00152340;
  return;
}

Assistant:

Message( const FIX::MsgType& msgtype )
    : FIX::Message(
      FIX::BeginString("FIX.4.3"), msgtype )
     {}